

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O3

void __thiscall CTcPrsMem::~CTcPrsMem(CTcPrsMem *this)

{
  tcprsmem_blk_t *ptVar1;
  tcprsmem_blk_t *__ptr;
  
  __ptr = this->head_;
  while (__ptr != (tcprsmem_blk_t *)0x0) {
    ptVar1 = __ptr->next_;
    free(__ptr);
    this->head_ = ptVar1;
    __ptr = ptVar1;
  }
  this->tail_ = (tcprsmem_blk_t *)0x0;
  return;
}

Assistant:

CTcPrsMem::~CTcPrsMem()
{
    /* delete all objects in our pool */
    delete_all();
}